

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# es3fShaderPackingFunctionTests.cpp
# Opt level: O0

IterateResult __thiscall
deqp::gles3::Functional::UnpackHalf2x16Case::iterate(UnpackHalf2x16Case *this)

{
  pointer *this_00;
  ShaderExecutor *pSVar1;
  float fVar2;
  bool bVar3;
  StorageType_conflict SVar4;
  StorageType_conflict SVar5;
  deUint32 dVar6;
  char *pcVar7;
  size_type sVar8;
  TestLog *pTVar9;
  MessageBuilder *pMVar10;
  reference pvVar11;
  reference pvVar12;
  float *pfVar13;
  int local_77c;
  int local_74c;
  MessageBuilder local_748;
  MessageBuilder local_5c8;
  Hex<8UL> local_448;
  Hex<8UL> local_440;
  Hex<8UL> local_438;
  Hex<8UL> local_430;
  Hex<8UL> local_428;
  MessageBuilder local_420;
  int local_29c;
  int local_298;
  int diff1;
  int diff0;
  Float<unsigned_int,_8,_23,_127,_3U> local_28c;
  deUint32 resBits1;
  Float<unsigned_int,_8,_23,_127,_3U> local_284;
  deUint32 resBits0;
  Float<unsigned_int,_8,_23,_127,_3U> local_27c;
  deUint32 refBits1;
  float local_274;
  deUint32 refBits0;
  float res1;
  float res0;
  Float<unsigned_short,_5,_10,_15,_3U> local_262;
  float ref1;
  StorageType_conflict local_25c;
  StorageType_conflict local_25a;
  float ref0;
  deUint16 in1;
  deUint16 in0;
  int valNdx;
  int numFailed;
  int maxPrints;
  int numValues;
  void *out;
  void *in;
  MessageBuilder local_230;
  Float<unsigned_short,_5,_10,_15,_3U> local_b0;
  StorageType_conflict local_ae;
  uint local_ac;
  int iStack_a8;
  deUint16 value;
  deUint32 mantissa;
  int exp;
  int s;
  int c;
  deUint32 inVal;
  int ndx;
  int mantBits;
  int maxExp;
  int minExp;
  Float<unsigned_short,_5,_10,_15,_3U> local_80;
  Float<unsigned_short,_5,_10,_15,_3U> local_7e;
  value_type_conflict4 local_7c;
  Float<unsigned_short,_5,_10,_15,_3U> local_78;
  Float<unsigned_short,_5,_10,_15,_3U> local_76;
  value_type_conflict4 local_74;
  Float<unsigned_short,_5,_10,_15,_3U> local_6e [8];
  Float<unsigned_short,_5,_10,_15,_3U> local_5e;
  value_type_conflict4 local_5c;
  undefined1 local_58 [8];
  vector<tcu::Vector<float,_2>,_std::allocator<tcu::Vector<float,_2>_>_> outputs;
  vector<unsigned_int,_std::allocator<unsigned_int>_> inputs;
  Random rnd;
  int maxDiff;
  UnpackHalf2x16Case *this_local;
  
  rnd.m_rnd.z = 0;
  unique0x100013fb = this;
  pcVar7 = tcu::TestNode::getName((TestNode *)this);
  dVar6 = deStringHash(pcVar7);
  de::Random::Random((Random *)
                     ((long)&inputs.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>.
                             _M_impl.super__Vector_impl_data._M_end_of_storage + 4),dVar6 ^ 0x776002
                    );
  std::vector<unsigned_int,_std::allocator<unsigned_int>_>::vector
            ((vector<unsigned_int,_std::allocator<unsigned_int>_> *)
             &outputs.
              super__Vector_base<tcu::Vector<float,_2>,_std::allocator<tcu::Vector<float,_2>_>_>.
              _M_impl.super__Vector_impl_data._M_end_of_storage);
  std::vector<tcu::Vector<float,_2>,_std::allocator<tcu::Vector<float,_2>_>_>::vector
            ((vector<tcu::Vector<float,_2>,_std::allocator<tcu::Vector<float,_2>_>_> *)local_58);
  tcu::Float<unsigned_short,_5,_10,_15,_3U>::Float(&local_5e,0.0);
  SVar4 = tcu::Float<unsigned_short,_5,_10,_15,_3U>::bits(&local_5e);
  tcu::Float<unsigned_short,_5,_10,_15,_3U>::Float(local_6e,1.0);
  SVar5 = tcu::Float<unsigned_short,_5,_10,_15,_3U>::bits(local_6e);
  local_5c = CONCAT22(SVar4,SVar5);
  std::vector<unsigned_int,_std::allocator<unsigned_int>_>::push_back
            ((vector<unsigned_int,_std::allocator<unsigned_int>_> *)
             &outputs.
              super__Vector_base<tcu::Vector<float,_2>,_std::allocator<tcu::Vector<float,_2>_>_>.
              _M_impl.super__Vector_impl_data._M_end_of_storage,&local_5c);
  tcu::Float<unsigned_short,_5,_10,_15,_3U>::Float(&local_76,1.0);
  SVar4 = tcu::Float<unsigned_short,_5,_10,_15,_3U>::bits(&local_76);
  tcu::Float<unsigned_short,_5,_10,_15,_3U>::Float(&local_78,0.0);
  SVar5 = tcu::Float<unsigned_short,_5,_10,_15,_3U>::bits(&local_78);
  local_74 = CONCAT22(SVar4,SVar5);
  std::vector<unsigned_int,_std::allocator<unsigned_int>_>::push_back
            ((vector<unsigned_int,_std::allocator<unsigned_int>_> *)
             &outputs.
              super__Vector_base<tcu::Vector<float,_2>,_std::allocator<tcu::Vector<float,_2>_>_>.
              _M_impl.super__Vector_impl_data._M_end_of_storage,&local_74);
  tcu::Float<unsigned_short,_5,_10,_15,_3U>::Float(&local_7e,-1.0);
  SVar4 = tcu::Float<unsigned_short,_5,_10,_15,_3U>::bits(&local_7e);
  tcu::Float<unsigned_short,_5,_10,_15,_3U>::Float(&local_80,0.5);
  SVar5 = tcu::Float<unsigned_short,_5,_10,_15,_3U>::bits(&local_80);
  local_7c = CONCAT22(SVar4,SVar5);
  std::vector<unsigned_int,_std::allocator<unsigned_int>_>::push_back
            ((vector<unsigned_int,_std::allocator<unsigned_int>_> *)
             &outputs.
              super__Vector_base<tcu::Vector<float,_2>,_std::allocator<tcu::Vector<float,_2>_>_>.
              _M_impl.super__Vector_impl_data._M_end_of_storage,&local_7c);
  tcu::Float<unsigned_short,_5,_10,_15,_3U>::Float
            ((Float<unsigned_short,_5,_10,_15,_3U> *)((long)&maxExp + 2),0.5);
  SVar4 = tcu::Float<unsigned_short,_5,_10,_15,_3U>::bits
                    ((Float<unsigned_short,_5,_10,_15,_3U> *)((long)&maxExp + 2));
  tcu::Float<unsigned_short,_5,_10,_15,_3U>::Float
            ((Float<unsigned_short,_5,_10,_15,_3U> *)&maxExp,-0.5);
  SVar5 = tcu::Float<unsigned_short,_5,_10,_15,_3U>::bits
                    ((Float<unsigned_short,_5,_10,_15,_3U> *)&maxExp);
  minExp = CONCAT22(SVar4,SVar5);
  std::vector<unsigned_int,_std::allocator<unsigned_int>_>::push_back
            ((vector<unsigned_int,_std::allocator<unsigned_int>_> *)
             &outputs.
              super__Vector_base<tcu::Vector<float,_2>,_std::allocator<tcu::Vector<float,_2>_>_>.
              _M_impl.super__Vector_impl_data._M_end_of_storage,(value_type_conflict4 *)&minExp);
  mantBits = -0xe;
  ndx = 0xf;
  inVal = 10;
  for (c = 0; c < 0x60; c = c + 1) {
    s = 0;
    for (exp = 0; exp < 2; exp = exp + 1) {
      bVar3 = de::Random::getBool((Random *)
                                  ((long)&inputs.
                                          super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>
                                          ._M_impl.super__Vector_impl_data._M_end_of_storage + 4));
      mantissa = bVar3 - 1 | 1;
      iStack_a8 = de::Random::getInt((Random *)
                                     ((long)&inputs.
                                             super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>
                                             ._M_impl.super__Vector_impl_data._M_end_of_storage + 4)
                                     ,-0xe,0xf);
      dVar6 = de::Random::getUint32
                        ((Random *)
                         ((long)&inputs.
                                 super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>.
                                 _M_impl.super__Vector_impl_data._M_end_of_storage + 4));
      local_ac = dVar6 & 0x3ff;
      if (iStack_a8 == 0) {
        local_77c = 1;
      }
      else {
        local_77c = iStack_a8;
      }
      local_b0 = tcu::Float<unsigned_short,_5,_10,_15,_3U>::construct
                           (mantissa,local_77c,(ushort)local_ac | 0x400);
      local_ae = tcu::Float<unsigned_short,_5,_10,_15,_3U>::bits(&local_b0);
      s = (uint)local_ae << ((byte)(exp << 4) & 0x1f) | s;
    }
    std::vector<unsigned_int,_std::allocator<unsigned_int>_>::push_back
              ((vector<unsigned_int,_std::allocator<unsigned_int>_> *)
               &outputs.
                super__Vector_base<tcu::Vector<float,_2>,_std::allocator<tcu::Vector<float,_2>_>_>.
                _M_impl.super__Vector_impl_data._M_end_of_storage,(value_type_conflict4 *)&s);
  }
  sVar8 = std::vector<unsigned_int,_std::allocator<unsigned_int>_>::size
                    ((vector<unsigned_int,_std::allocator<unsigned_int>_> *)
                     &outputs.
                      super__Vector_base<tcu::Vector<float,_2>,_std::allocator<tcu::Vector<float,_2>_>_>
                      ._M_impl.super__Vector_impl_data._M_end_of_storage);
  std::vector<tcu::Vector<float,_2>,_std::allocator<tcu::Vector<float,_2>_>_>::resize
            ((vector<tcu::Vector<float,_2>,_std::allocator<tcu::Vector<float,_2>_>_> *)local_58,
             sVar8);
  pTVar9 = tcu::TestContext::getLog
                     ((this->super_ShaderPackingFunctionCase).super_TestCase.super_TestCase.
                      super_TestNode.m_testCtx);
  tcu::TestLog::operator<<(&local_230,pTVar9,(BeginMessageToken *)&tcu::TestLog::Message);
  pMVar10 = tcu::MessageBuilder::operator<<(&local_230,(char (*) [22])"Executing shader for ");
  in = (void *)std::vector<unsigned_int,_std::allocator<unsigned_int>_>::size
                         ((vector<unsigned_int,_std::allocator<unsigned_int>_> *)
                          &outputs.
                           super__Vector_base<tcu::Vector<float,_2>,_std::allocator<tcu::Vector<float,_2>_>_>
                           ._M_impl.super__Vector_impl_data._M_end_of_storage);
  pMVar10 = tcu::MessageBuilder::operator<<(pMVar10,(unsigned_long *)&in);
  pMVar10 = tcu::MessageBuilder::operator<<(pMVar10,(char (*) [14])" input values");
  tcu::MessageBuilder::operator<<(pMVar10,(EndMessageToken *)&tcu::TestLog::EndMessage);
  tcu::MessageBuilder::~MessageBuilder(&local_230);
  out = std::vector<unsigned_int,_std::allocator<unsigned_int>_>::operator[]
                  ((vector<unsigned_int,_std::allocator<unsigned_int>_> *)
                   &outputs.
                    super__Vector_base<tcu::Vector<float,_2>,_std::allocator<tcu::Vector<float,_2>_>_>
                    ._M_impl.super__Vector_impl_data._M_end_of_storage,0);
  _maxPrints = std::vector<tcu::Vector<float,_2>,_std::allocator<tcu::Vector<float,_2>_>_>::
               operator[]((vector<tcu::Vector<float,_2>,_std::allocator<tcu::Vector<float,_2>_>_> *)
                          local_58,0);
  (*((this->super_ShaderPackingFunctionCase).m_executor)->_vptr_ShaderExecutor[5])();
  pSVar1 = (this->super_ShaderPackingFunctionCase).m_executor;
  sVar8 = std::vector<unsigned_int,_std::allocator<unsigned_int>_>::size
                    ((vector<unsigned_int,_std::allocator<unsigned_int>_> *)
                     &outputs.
                      super__Vector_base<tcu::Vector<float,_2>,_std::allocator<tcu::Vector<float,_2>_>_>
                      ._M_impl.super__Vector_impl_data._M_end_of_storage);
  (*pSVar1->_vptr_ShaderExecutor[6])(pSVar1,sVar8 & 0xffffffff,&out,&maxPrints);
  sVar8 = std::vector<unsigned_int,_std::allocator<unsigned_int>_>::size
                    ((vector<unsigned_int,_std::allocator<unsigned_int>_> *)
                     &outputs.
                      super__Vector_base<tcu::Vector<float,_2>,_std::allocator<tcu::Vector<float,_2>_>_>
                      ._M_impl.super__Vector_impl_data._M_end_of_storage);
  numFailed = (int)sVar8;
  valNdx = 10;
  _in1 = 0;
  for (ref0 = 0.0; fVar2 = ref0,
      sVar8 = std::vector<unsigned_int,_std::allocator<unsigned_int>_>::size
                        ((vector<unsigned_int,_std::allocator<unsigned_int>_> *)
                         &outputs.
                          super__Vector_base<tcu::Vector<float,_2>,_std::allocator<tcu::Vector<float,_2>_>_>
                          ._M_impl.super__Vector_impl_data._M_end_of_storage),
      (int)fVar2 < (int)sVar8; ref0 = (float)((int)ref0 + 1)) {
    this_00 = &outputs.
               super__Vector_base<tcu::Vector<float,_2>,_std::allocator<tcu::Vector<float,_2>_>_>.
               _M_impl.super__Vector_impl_data._M_end_of_storage;
    pvVar11 = std::vector<unsigned_int,_std::allocator<unsigned_int>_>::operator[]
                        ((vector<unsigned_int,_std::allocator<unsigned_int>_> *)this_00,
                         (long)(int)ref0);
    local_25a = (StorageType_conflict)*pvVar11;
    pvVar11 = std::vector<unsigned_int,_std::allocator<unsigned_int>_>::operator[]
                        ((vector<unsigned_int,_std::allocator<unsigned_int>_> *)this_00,
                         (long)(int)ref0);
    local_25c = *(StorageType_conflict *)((long)pvVar11 + 2);
    tcu::Float<unsigned_short,_5,_10,_15,_3U>::Float(&local_262,local_25a);
    ref1 = tcu::Float<unsigned_short,_5,_10,_15,_3U>::asFloat(&local_262);
    tcu::Float<unsigned_short,_5,_10,_15,_3U>::Float
              ((Float<unsigned_short,_5,_10,_15,_3U> *)((long)&res1 + 2),local_25c);
    res0 = tcu::Float<unsigned_short,_5,_10,_15,_3U>::asFloat
                     ((Float<unsigned_short,_5,_10,_15,_3U> *)((long)&res1 + 2));
    pvVar12 = std::vector<tcu::Vector<float,_2>,_std::allocator<tcu::Vector<float,_2>_>_>::
              operator[]((vector<tcu::Vector<float,_2>,_std::allocator<tcu::Vector<float,_2>_>_> *)
                         local_58,(long)(int)ref0);
    pfVar13 = tcu::Vector<float,_2>::x(pvVar12);
    refBits0 = (deUint32)*pfVar13;
    pvVar12 = std::vector<tcu::Vector<float,_2>,_std::allocator<tcu::Vector<float,_2>_>_>::
              operator[]((vector<tcu::Vector<float,_2>,_std::allocator<tcu::Vector<float,_2>_>_> *)
                         local_58,(long)(int)ref0);
    pfVar13 = tcu::Vector<float,_2>::y(pvVar12);
    local_274 = *pfVar13;
    tcu::Float<unsigned_int,_8,_23,_127,_3U>::Float(&local_27c,ref1);
    refBits1 = tcu::Float<unsigned_int,_8,_23,_127,_3U>::bits(&local_27c);
    tcu::Float<unsigned_int,_8,_23,_127,_3U>::Float(&local_284,res0);
    resBits0 = tcu::Float<unsigned_int,_8,_23,_127,_3U>::bits(&local_284);
    tcu::Float<unsigned_int,_8,_23,_127,_3U>::Float(&local_28c,(float)refBits0);
    resBits1 = tcu::Float<unsigned_int,_8,_23,_127,_3U>::bits(&local_28c);
    tcu::Float<unsigned_int,_8,_23,_127,_3U>::Float
              ((Float<unsigned_int,_8,_23,_127,_3U> *)&diff1,local_274);
    diff0 = tcu::Float<unsigned_int,_8,_23,_127,_3U>::bits
                      ((Float<unsigned_int,_8,_23,_127,_3U> *)&diff1);
    local_298 = de::abs<int>(refBits1 - resBits1);
    local_29c = de::abs<int>(resBits0 - diff0);
    if ((0 < local_298) || (0 < local_29c)) {
      if (_in1 < 10) {
        pTVar9 = tcu::TestContext::getLog
                           ((this->super_ShaderPackingFunctionCase).super_TestCase.super_TestCase.
                            super_TestNode.m_testCtx);
        tcu::TestLog::operator<<(&local_420,pTVar9,(BeginMessageToken *)&tcu::TestLog::Message);
        pMVar10 = tcu::MessageBuilder::operator<<
                            (&local_420,(char (*) [26])"ERROR: Mismatch in value ");
        pMVar10 = tcu::MessageBuilder::operator<<(pMVar10,(int *)&ref0);
        pMVar10 = tcu::MessageBuilder::operator<<(pMVar10,(char (*) [3])0x2ad84e3);
        pMVar10 = tcu::MessageBuilder::operator<<
                            (pMVar10,(char (*) [27])"  expected unpackHalf2x16(");
        pvVar11 = std::vector<unsigned_int,_std::allocator<unsigned_int>_>::operator[]
                            ((vector<unsigned_int,_std::allocator<unsigned_int>_> *)
                             &outputs.
                              super__Vector_base<tcu::Vector<float,_2>,_std::allocator<tcu::Vector<float,_2>_>_>
                              ._M_impl.super__Vector_impl_data._M_end_of_storage,(long)(int)ref0);
        local_428 = tcu::toHex<unsigned_int>(*pvVar11);
        pMVar10 = tcu::MessageBuilder::operator<<(pMVar10,&local_428);
        pMVar10 = tcu::MessageBuilder::operator<<(pMVar10,(char (*) [5])0x2bc4012);
        pMVar10 = tcu::MessageBuilder::operator<<(pMVar10,(char (*) [6])0x2bfa4eb);
        pMVar10 = tcu::MessageBuilder::operator<<(pMVar10,&ref1);
        pMVar10 = tcu::MessageBuilder::operator<<(pMVar10,(char (*) [4])0x2b88b0c);
        local_430 = tcu::toHex<unsigned_int>(refBits1);
        pMVar10 = tcu::MessageBuilder::operator<<(pMVar10,&local_430);
        pMVar10 = tcu::MessageBuilder::operator<<(pMVar10,(char (*) [3])0x2a3caab);
        pMVar10 = tcu::MessageBuilder::operator<<(pMVar10,&res0);
        pMVar10 = tcu::MessageBuilder::operator<<(pMVar10,(char (*) [4])0x2b88b0c);
        local_438 = tcu::toHex<unsigned_int>(resBits0);
        pMVar10 = tcu::MessageBuilder::operator<<(pMVar10,&local_438);
        pMVar10 = tcu::MessageBuilder::operator<<(pMVar10,(char (*) [2])0x2a85ff4);
        pMVar10 = tcu::MessageBuilder::operator<<(pMVar10,(char (*) [12])", got vec2(");
        pMVar10 = tcu::MessageBuilder::operator<<(pMVar10,(float *)&refBits0);
        pMVar10 = tcu::MessageBuilder::operator<<(pMVar10,(char (*) [4])0x2b88b0c);
        local_440 = tcu::toHex<unsigned_int>(resBits1);
        pMVar10 = tcu::MessageBuilder::operator<<(pMVar10,&local_440);
        pMVar10 = tcu::MessageBuilder::operator<<(pMVar10,(char (*) [3])0x2a3caab);
        pMVar10 = tcu::MessageBuilder::operator<<(pMVar10,&local_274);
        pMVar10 = tcu::MessageBuilder::operator<<(pMVar10,(char (*) [4])0x2b88b0c);
        local_448 = tcu::toHex<unsigned_int>(diff0);
        pMVar10 = tcu::MessageBuilder::operator<<(pMVar10,&local_448);
        pMVar10 = tcu::MessageBuilder::operator<<(pMVar10,(char (*) [2])0x2a85ff4);
        pMVar10 = tcu::MessageBuilder::operator<<(pMVar10,(char (*) [17])"\n  ULP diffs = (");
        pMVar10 = tcu::MessageBuilder::operator<<(pMVar10,&local_298);
        pMVar10 = tcu::MessageBuilder::operator<<(pMVar10,(char (*) [3])0x2a3caab);
        pMVar10 = tcu::MessageBuilder::operator<<(pMVar10,&local_29c);
        pMVar10 = tcu::MessageBuilder::operator<<(pMVar10,(char (*) [15])"), max diff = ");
        pMVar10 = tcu::MessageBuilder::operator<<(pMVar10,(int *)&rnd.m_rnd.z);
        tcu::MessageBuilder::operator<<(pMVar10,(EndMessageToken *)&tcu::TestLog::EndMessage);
        tcu::MessageBuilder::~MessageBuilder(&local_420);
      }
      else if (_in1 == 10) {
        pTVar9 = tcu::TestContext::getLog
                           ((this->super_ShaderPackingFunctionCase).super_TestCase.super_TestCase.
                            super_TestNode.m_testCtx);
        tcu::TestLog::operator<<(&local_5c8,pTVar9,(BeginMessageToken *)&tcu::TestLog::Message);
        pMVar10 = tcu::MessageBuilder::operator<<(&local_5c8,(char (*) [4])0x2b51841);
        tcu::MessageBuilder::operator<<(pMVar10,(EndMessageToken *)&tcu::TestLog::EndMessage);
        tcu::MessageBuilder::~MessageBuilder(&local_5c8);
      }
      _in1 = _in1 + 1;
    }
  }
  pTVar9 = tcu::TestContext::getLog
                     ((this->super_ShaderPackingFunctionCase).super_TestCase.super_TestCase.
                      super_TestNode.m_testCtx);
  tcu::TestLog::operator<<(&local_748,pTVar9,(BeginMessageToken *)&tcu::TestLog::Message);
  local_74c = numFailed - _in1;
  pMVar10 = tcu::MessageBuilder::operator<<(&local_748,&local_74c);
  pMVar10 = tcu::MessageBuilder::operator<<(pMVar10,(char (*) [4])0x2b88b0c);
  pMVar10 = tcu::MessageBuilder::operator<<(pMVar10,&numFailed);
  pMVar10 = tcu::MessageBuilder::operator<<(pMVar10,(char (*) [15])" values passed");
  tcu::MessageBuilder::operator<<(pMVar10,(EndMessageToken *)&tcu::TestLog::EndMessage);
  tcu::MessageBuilder::~MessageBuilder(&local_748);
  pcVar7 = "Result comparison failed";
  if (_in1 == 0) {
    pcVar7 = "Pass";
  }
  tcu::TestContext::setTestResult
            ((this->super_ShaderPackingFunctionCase).super_TestCase.super_TestCase.super_TestNode.
             m_testCtx,(uint)(_in1 != 0),pcVar7);
  std::vector<tcu::Vector<float,_2>,_std::allocator<tcu::Vector<float,_2>_>_>::~vector
            ((vector<tcu::Vector<float,_2>,_std::allocator<tcu::Vector<float,_2>_>_> *)local_58);
  std::vector<unsigned_int,_std::allocator<unsigned_int>_>::~vector
            ((vector<unsigned_int,_std::allocator<unsigned_int>_> *)
             &outputs.
              super__Vector_base<tcu::Vector<float,_2>,_std::allocator<tcu::Vector<float,_2>_>_>.
              _M_impl.super__Vector_impl_data._M_end_of_storage);
  de::Random::~Random((Random *)
                      ((long)&inputs.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>
                              ._M_impl.super__Vector_impl_data._M_end_of_storage + 4));
  return STOP;
}

Assistant:

IterateResult iterate (void)
	{
		const int					maxDiff		= 0; // All bits must be accurate.
		de::Random					rnd			(deStringHash(getName()) ^ 0x776002);
		std::vector<deUint32>		inputs;
		std::vector<tcu::Vec2>		outputs;

		// Special values.
		inputs.push_back((tcu::Float16( 0.0f).bits() << 16) | tcu::Float16( 1.0f).bits());
		inputs.push_back((tcu::Float16( 1.0f).bits() << 16) | tcu::Float16( 0.0f).bits());
		inputs.push_back((tcu::Float16(-1.0f).bits() << 16) | tcu::Float16( 0.5f).bits());
		inputs.push_back((tcu::Float16( 0.5f).bits() << 16) | tcu::Float16(-0.5f).bits());

		// Construct random values.
		{
			const int	minExp		= -14;
			const int	maxExp		= 15;
			const int	mantBits	= 10;

			for (int ndx = 0; ndx < 96; ndx++)
			{
				deUint32 inVal = 0;
				for (int c = 0; c < 2; c++)
				{
					const int		s			= rnd.getBool() ? 1 : -1;
					const int		exp			= rnd.getInt(minExp, maxExp);
					const deUint32	mantissa	= rnd.getUint32() & ((1<<mantBits)-1);
					const deUint16	value		= tcu::Float16::construct(s, exp ? exp : 1 /* avoid denorm */, (deUint16)((1u<<10) | mantissa)).bits();

					inVal |= value << (16*c);
				}
				inputs.push_back(inVal);
			}
		}

		outputs.resize(inputs.size());

		m_testCtx.getLog() << TestLog::Message << "Executing shader for " << inputs.size() << " input values" << tcu::TestLog::EndMessage;

		{
			const void*	in	= &inputs[0];
			void*		out	= &outputs[0];

			m_executor->useProgram();
			m_executor->execute((int)inputs.size(), &in, &out);
		}

		// Verify
		{
			const int	numValues	= (int)inputs.size();
			const int	maxPrints	= 10;
			int			numFailed	= 0;

			for (int valNdx = 0; valNdx < (int)inputs.size(); valNdx++)
			{
				const deUint16	in0			= (deUint16)(inputs[valNdx] & 0xffff);
				const deUint16	in1			= (deUint16)(inputs[valNdx] >> 16);
				const float		ref0		= tcu::Float16(in0).asFloat();
				const float		ref1		= tcu::Float16(in1).asFloat();
				const float		res0		= outputs[valNdx].x();
				const float		res1		= outputs[valNdx].y();

				const deUint32	refBits0	= tcu::Float32(ref0).bits();
				const deUint32	refBits1	= tcu::Float32(ref1).bits();
				const deUint32	resBits0	= tcu::Float32(res0).bits();
				const deUint32	resBits1	= tcu::Float32(res1).bits();

				const int		diff0	= de::abs((int)refBits0 - (int)resBits0);
				const int		diff1	= de::abs((int)refBits1 - (int)resBits1);

				if (diff0 > maxDiff || diff1 > maxDiff)
				{
					if (numFailed < maxPrints)
					{
						m_testCtx.getLog() << TestLog::Message << "ERROR: Mismatch in value " << valNdx << ",\n"
															   << "  expected unpackHalf2x16(" << tcu::toHex(inputs[valNdx]) << ") = "
															   << "vec2(" << ref0 << " / " << tcu::toHex(refBits0) << ", " << ref1 << " / " << tcu::toHex(refBits1) << ")"
															   << ", got vec2(" << res0 << " / " << tcu::toHex(resBits0) << ", " << res1 << " / " << tcu::toHex(resBits1) << ")"
															   << "\n  ULP diffs = (" << diff0 << ", " << diff1 << "), max diff = " << maxDiff
										   << TestLog::EndMessage;
					}
					else if (numFailed == maxPrints)
						m_testCtx.getLog() << TestLog::Message << "..." << TestLog::EndMessage;

					numFailed += 1;
				}
			}

			m_testCtx.getLog() << TestLog::Message << (numValues - numFailed) << " / " << numValues << " values passed" << TestLog::EndMessage;

			m_testCtx.setTestResult(numFailed == 0 ? QP_TEST_RESULT_PASS	: QP_TEST_RESULT_FAIL,
									numFailed == 0 ? "Pass"					: "Result comparison failed");
		}

		return STOP;
	}